

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

size_t quicly_send_retry(quicly_context_t *ctx,ptls_aead_context_t *token_encrypt_ctx,
                        uint32_t protocol_version,sockaddr *dest_addr,ptls_iovec_t dest_cid,
                        sockaddr *src_addr,ptls_iovec_t src_cid,ptls_iovec_t odcid,
                        ptls_iovec_t token_prefix,ptls_iovec_t appdata,
                        ptls_aead_context_t **retry_aead_cache,uint8_t *datagram)

{
  ptls_iovec_t src;
  ptls_iovec_t src_00;
  ptls_iovec_t src_01;
  int iVar1;
  ptls_aead_context_t *aad;
  void *in_RCX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  void *in_stack_00000010;
  size_t in_stack_00000018;
  void *in_stack_00000020;
  size_t in_stack_00000028;
  void *in_stack_00000030;
  ulong in_stack_00000038;
  long *in_stack_00000050;
  ptls_aead_context_t *aead;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint32_t _v;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  int ret;
  ptls_buffer_t buf;
  quicly_address_token_plaintext_t token;
  sockaddr *in_stack_fffffffffffffa38;
  quicly_address_t *in_stack_fffffffffffffa40;
  ptls_buffer_t *in_stack_fffffffffffffa48;
  quicly_context_t *ctx_00;
  size_t inlen;
  void *input;
  undefined4 in_stack_fffffffffffffa70;
  undefined8 *aadlen;
  long local_548;
  long local_530;
  long local_510;
  undefined4 local_508 [2];
  undefined8 local_500;
  quicly_address_token_plaintext_t *in_stack_fffffffffffffb60;
  size_t in_stack_fffffffffffffb68;
  ptls_buffer_t *in_stack_fffffffffffffb70;
  ptls_aead_context_t *in_stack_fffffffffffffb78;
  _func_void_void_ptr_size_t *in_stack_fffffffffffffb80;
  int local_2ac;
  void *local_2a8;
  long local_2a0;
  size_t local_298;
  int local_290;
  undefined1 local_288 [336];
  undefined1 auStack_138 [256];
  undefined8 local_38;
  undefined8 *local_18;
  
  aadlen = (undefined8 *)&stack0x00000040;
  local_18 = in_RDI;
  if ((in_stack_00000018 == in_stack_00000028) &&
     (iVar1 = memcmp(in_stack_00000010,in_stack_00000020,in_stack_00000018), iVar1 == 0)) {
    __assert_fail("!(src_cid.len == odcid.len && memcmp(src_cid.base, odcid.base, src_cid.len) == 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xf1f,
                  "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                 );
  }
  memset(local_508,0,600);
  local_508[0] = 0;
  local_500 = (**(code **)local_18[0x1a])(local_18[0x1a]);
  memcpy(local_288,local_508,600);
  set_address(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  set_address(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  src.len = (size_t)in_stack_fffffffffffffa40;
  src.base = (uint8_t *)in_stack_fffffffffffffa38;
  quicly_set_cid((quicly_cid_t *)0x13a1a5,src);
  src_00.len = (size_t)in_stack_fffffffffffffa40;
  src_00.base = (uint8_t *)in_stack_fffffffffffffa38;
  quicly_set_cid((quicly_cid_t *)0x13a1ca,src_00);
  src_01.len = (size_t)in_stack_fffffffffffffa40;
  src_01.base = (uint8_t *)in_stack_fffffffffffffa38;
  quicly_set_cid((quicly_cid_t *)0x13a1eb,src_01);
  if (aadlen[1] != 0) {
    if (0x100 < (ulong)aadlen[1]) {
      __assert_fail("appdata.len <= sizeof(token.appdata.bytes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xf2a,
                    "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                   );
    }
    memcpy(auStack_138,(void *)*aadlen,aadlen[1]);
    local_38 = aadlen[1];
  }
  ptls_buffer_init((ptls_buffer_t *)&in_stack_fffffffffffffa40->sa,in_stack_fffffffffffffa38,
                   0x13a272);
  local_510 = 1;
  input = (void *)0x1;
  local_2ac = ptls_buffer__do_pushv
                        (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                         (size_t)in_stack_fffffffffffffa38);
  if ((local_2ac == 0) &&
     (local_2ac = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                             (size_t)in_stack_fffffffffffffa38), local_2ac == 0)) {
    for (; local_510 != 0; local_510 = local_510 + -1) {
      *(char *)((long)local_2a8 + (local_298 - local_510)) =
           (char)(0L >> (((char)local_510 + -1) * '\b' & 0x3fU));
    }
    (**(code **)*local_18)((long)local_2a8 + local_298,1);
    *(byte *)((long)local_2a8 + local_298) = *(byte *)((long)local_2a8 + local_298) & 0xf | 0xf0;
    local_298 = local_298 + 1;
    local_2ac = ptls_buffer__do_pushv
                          (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                           (size_t)in_stack_fffffffffffffa38);
    if (local_2ac == 0) {
      local_530 = 1;
      inlen = 1;
      local_2ac = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                             (size_t)in_stack_fffffffffffffa38);
      if ((local_2ac == 0) &&
         (local_2ac = ptls_buffer__do_pushv
                                (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                                 (size_t)in_stack_fffffffffffffa38), local_2ac == 0)) {
        for (; local_530 != 0; local_530 = local_530 + -1) {
          *(char *)((long)local_2a8 + (local_298 - local_530)) =
               (char)(0L >> (((char)local_530 + -1) * '\b' & 0x3fU));
        }
        local_548 = 1;
        ctx_00 = (quicly_context_t *)0x1;
        local_2ac = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                               (size_t)in_stack_fffffffffffffa38);
        if ((local_2ac == 0) &&
           (local_2ac = ptls_buffer__do_pushv
                                  (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                                   (size_t)in_stack_fffffffffffffa38), local_2ac == 0)) {
          for (; local_548 != 0; local_548 = local_548 + -1) {
            *(char *)((long)local_2a8 + (local_298 - local_548)) =
                 (char)(0L >> (((char)local_548 + -1) * '\b' & 0x3fU));
          }
          if (in_stack_00000038 != 0) {
            if (local_2a0 - local_298 < in_stack_00000038) {
              __assert_fail("token_prefix.len <= buf.capacity - buf.off",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0xf3b,
                            "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                           );
            }
            memcpy((void *)((long)local_2a8 + local_298),in_stack_00000030,in_stack_00000038);
            local_298 = in_stack_00000038 + local_298;
          }
          local_2ac = quicly_encrypt_address_token
                                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                                 in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                 in_stack_fffffffffffffb60);
          if (local_2ac == 0) {
            iVar1 = ptls_buffer_reserve(in_stack_fffffffffffffa48,(size_t)in_stack_fffffffffffffa40)
            ;
            if (iVar1 != 0) {
              __assert_fail("ret == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0xf45,
                            "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                           );
            }
            if (local_290 != 0) {
              __assert_fail("!buf.is_allocated && \"retry packet is too large\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0xf46,
                            "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                           );
            }
            if ((in_stack_00000050 == (long *)0x0) || (*in_stack_00000050 == 0)) {
              aad = create_retry_aead(ctx_00,(uint32_t)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                                      (int)in_stack_fffffffffffffa48);
            }
            else {
              aad = (ptls_aead_context_t *)*in_stack_00000050;
            }
            ptls_aead_encrypt((ptls_aead_context_t *)CONCAT44(in_EDX,in_stack_fffffffffffffa70),
                              in_RCX,input,inlen,(uint64_t)ctx_00,aad,(size_t)aadlen);
            if (in_stack_00000050 == (long *)0x0) {
              ptls_aead_free((ptls_aead_context_t *)0x13a928);
            }
            else {
              *in_stack_00000050 = (long)aad;
            }
            memmove(local_2a8,(void *)((long)local_2a8 + in_stack_00000028 + 1),
                    (local_298 + 0x10) - (in_stack_00000028 + 1));
            local_298 = (local_298 + 0x10) - (in_stack_00000028 + 1);
            local_2ac = 0;
          }
        }
      }
    }
  }
  if (local_2ac != 0) {
    local_298 = 0xffffffffffffffff;
  }
  return local_298;
}

Assistant:

size_t quicly_send_retry(quicly_context_t *ctx, ptls_aead_context_t *token_encrypt_ctx, uint32_t protocol_version,
                         struct sockaddr *dest_addr, ptls_iovec_t dest_cid, struct sockaddr *src_addr, ptls_iovec_t src_cid,
                         ptls_iovec_t odcid, ptls_iovec_t token_prefix, ptls_iovec_t appdata,
                         ptls_aead_context_t **retry_aead_cache, uint8_t *datagram)
{
    quicly_address_token_plaintext_t token;
    ptls_buffer_t buf;
    int ret;

    assert(!(src_cid.len == odcid.len && memcmp(src_cid.base, odcid.base, src_cid.len) == 0));

    /* build token as plaintext */
    token = (quicly_address_token_plaintext_t){QUICLY_ADDRESS_TOKEN_TYPE_RETRY, ctx->now->cb(ctx->now)};
    set_address(&token.remote, dest_addr);
    set_address(&token.local, src_addr);

    quicly_set_cid(&token.retry.original_dcid, odcid);
    quicly_set_cid(&token.retry.client_cid, dest_cid);
    quicly_set_cid(&token.retry.server_cid, src_cid);
    if (appdata.len != 0) {
        assert(appdata.len <= sizeof(token.appdata.bytes));
        memcpy(token.appdata.bytes, appdata.base, appdata.len);
        token.appdata.len = appdata.len;
    }

    /* start building the packet */
    ptls_buffer_init(&buf, datagram, QUICLY_MIN_CLIENT_INITIAL_SIZE);

    /* first generate a pseudo packet */
    ptls_buffer_push_block(&buf, 1, { ptls_buffer_pushv(&buf, odcid.base, odcid.len); });
    ctx->tls->random_bytes(buf.base + buf.off, 1);
    buf.base[buf.off] = QUICLY_PACKET_TYPE_RETRY | (buf.base[buf.off] & 0x0f);
    ++buf.off;
    ptls_buffer_push32(&buf, protocol_version);
    ptls_buffer_push_block(&buf, 1, { ptls_buffer_pushv(&buf, dest_cid.base, dest_cid.len); });
    ptls_buffer_push_block(&buf, 1, { ptls_buffer_pushv(&buf, src_cid.base, src_cid.len); });
    if (token_prefix.len != 0) {
        assert(token_prefix.len <= buf.capacity - buf.off);
        memcpy(buf.base + buf.off, token_prefix.base, token_prefix.len);
        buf.off += token_prefix.len;
    }
    if ((ret = quicly_encrypt_address_token(ctx->tls->random_bytes, token_encrypt_ctx, &buf, buf.off - token_prefix.len, &token)) !=
        0)
        goto Exit;

    /* append AEAD tag */
    ret = ptls_buffer_reserve(&buf, PTLS_AESGCM_TAG_SIZE);
    assert(ret == 0);
    assert(!buf.is_allocated && "retry packet is too large");
    {
        ptls_aead_context_t *aead =
            retry_aead_cache != NULL && *retry_aead_cache != NULL ? *retry_aead_cache : create_retry_aead(ctx, protocol_version, 1);
        ptls_aead_encrypt(aead, buf.base + buf.off, "", 0, 0, buf.base, buf.off);
        if (retry_aead_cache != NULL) {
            *retry_aead_cache = aead;
        } else {
            ptls_aead_free(aead);
        }
    }
    buf.off += PTLS_AESGCM_TAG_SIZE;

    /* convert the image to a Retry packet, by stripping the ODCID field */
    memmove(buf.base, buf.base + odcid.len + 1, buf.off - (odcid.len + 1));
    buf.off -= odcid.len + 1;

    ret = 0;

Exit:
    return ret == 0 ? buf.off : SIZE_MAX;
}